

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauDsd.c
# Opt level: O1

int Dau_DsdDecomposeInt(Dau_Dsd_t *p,word *pTruth,int nVarsInit)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  int iVar4;
  char cVar5;
  int iVar6;
  long lVar7;
  size_t __n;
  int pVars [16];
  int local_78 [18];
  
  if (0x10 < (uint)nVarsInit) {
    __assert_fail("nVarsInit >= 0 && nVarsInit <= 16",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dau/dauDsd.c"
                  ,0x3dc,"void Dau_DsdInitialize(Dau_Dsd_t *, int)");
  }
  p->nVarsInit = nVarsInit;
  p->nVarsUsed = nVarsInit;
  p->nPos = 0;
  p->nSizeNonDec = 0;
  p->nConsts = 0;
  p->uConstMask = 0;
  if (nVarsInit != 0) {
    uVar3 = 0;
    do {
      p->pVarDefs[uVar3][0] = (char)uVar3 + 'a';
      p->pVarDefs[uVar3][1] = '\0';
      uVar3 = uVar3 + 1;
    } while ((uint)nVarsInit != uVar3);
    __n = 1;
    if (1 < nVarsInit) {
      __n = (size_t)(uint)nVarsInit;
    }
    lVar7 = 0;
    do {
      memset(p->Cache[0] + lVar7,0,__n);
      lVar7 = lVar7 + 0x20;
    } while (__n << 5 != lVar7);
  }
  iVar1 = Dau_DsdMinBase(pTruth,nVarsInit,local_78);
  if ((0 < iVar1) && (iVar1 <= nVarsInit)) {
    if (iVar1 == 1) {
      Dau_DsdWriteVar(p,local_78[0],(uint)*pTruth & 1);
      iVar1 = 0;
    }
    else if (iVar1 < 7) {
      iVar1 = Dau_Dsd6DecomposeInternal(p,pTruth,local_78,iVar1);
    }
    else {
      iVar1 = Dau_DsdDecomposeInternal(p,pTruth,local_78,iVar1);
    }
    iVar6 = p->nConsts;
    if (0 < iVar6) {
      iVar2 = 0;
      iVar4 = -1;
      do {
        cVar5 = ']';
        if (((uint)p->uConstMask >> (iVar6 + iVar4 & 0x1fU) & 1) == 0) {
          cVar5 = ')';
        }
        iVar6 = p->nPos;
        p->nPos = iVar6 + 1;
        p->pOutput[iVar6] = cVar5;
        iVar2 = iVar2 + 1;
        iVar6 = p->nConsts;
        iVar4 = iVar4 + -1;
      } while (iVar2 < iVar6);
    }
    iVar6 = p->nPos;
    p->nPos = iVar6 + 1;
    p->pOutput[iVar6] = '\0';
    return iVar1;
  }
  __assert_fail("nVars > 0 && nVars <= nVarsInit",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dau/dauDsd.c"
                ,0x76e,"int Dau_DsdDecomposeInt(Dau_Dsd_t *, word *, int)");
}

Assistant:

int Dau_DsdDecomposeInt( Dau_Dsd_t * p, word * pTruth, int nVarsInit )
{
    int Status = 0, nVars, pVars[16];
    Dau_DsdInitialize( p, nVarsInit );
    nVars = Dau_DsdMinBase( pTruth, nVarsInit, pVars );
    assert( nVars > 0 && nVars <= nVarsInit );
    if ( nVars == 1 )
        Dau_DsdWriteVar( p, pVars[0], (int)(pTruth[0] & 1) );
    else if ( nVars <= 6 )
        Status = Dau_Dsd6DecomposeInternal( p, pTruth, pVars, nVars );
    else
        Status = Dau_DsdDecomposeInternal( p, pTruth, pVars, nVars );
    Dau_DsdFinalize( p );
    return Status;
}